

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::scroll(QGraphicsItem *this,qreal dx,qreal dy,QRectF *rect)

{
  undefined4 uVar1;
  QGraphicsItemPrivate *this_00;
  KeyData *pKVar2;
  undefined4 uVar3;
  QRect QVar4;
  undefined1 auVar5 [16];
  char cVar6;
  QGraphicsItemCache *pQVar7;
  pointer pQVar8;
  QRect *r;
  QRect *pQVar9;
  QRect *exposedRect;
  double *pdVar10;
  long lVar11;
  long in_FS_OFFSET;
  ulong uVar12;
  double dVar13;
  QRegion exposed;
  QPoint local_98;
  QRegion local_90;
  QRectF local_88;
  QRect local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  QVar4._8_8_ = local_68._8_8_;
  QVar4._0_8_ = local_68._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (((((dx == 0.0) && (!NAN(dx))) && (dy == 0.0)) && (!NAN(dy))) ||
     (local_68 = QVar4, this_00->scene == (QGraphicsScene *)0x0)) {
LAB_00578c8c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    if ((((*(uint *)&this_00->field_0x160 & 0x600000) == 0x200000) &&
        (dVar13 = dx - (double)(int)dx, uVar12 = -(ulong)(dVar13 < -dVar13),
        (double)(~uVar12 & (ulong)dVar13 | (ulong)-dVar13 & uVar12) <= 1e-12)) &&
       (dVar13 = dy - (double)(int)dy, uVar12 = -(ulong)(dVar13 < -dVar13),
       (double)(~uVar12 & (ulong)dVar13 | (ulong)-dVar13 & uVar12) <= 1e-12)) {
      pQVar7 = QGraphicsItemPrivate::extraItemCache(this_00);
      if ((pQVar7->allExposed == false) &&
         (((pQVar7->fixedSize).wd.m_i < 0 || ((pQVar7->fixedSize).ht.m_i < 0)))) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QPixmap::QPixmap((QPixmap *)&local_58);
        cVar6 = QPixmapCache::find(&pQVar7->key,(QPixmap *)&local_58);
        if (cVar6 == '\0') {
          update(this,rect);
        }
        else {
          if ((rect->w != 0.0) || (NAN(rect->w))) {
LAB_00578a74:
            local_88.xp = rect->xp;
            local_88.yp = rect->yp;
            local_88.w = rect->w;
            local_88.h = rect->h;
          }
          else {
            if ((rect->h != 0.0) || (NAN(rect->h))) goto LAB_00578a74;
            (*this->_vptr_QGraphicsItem[3])(&local_88,this);
          }
          local_68 = (QRect)QRectF::toAlignedRect();
          cVar6 = QRect::intersects(&local_68);
          if (cVar6 != '\0') {
            QPixmapCache::remove(&pQVar7->key);
            local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_90);
            uVar12._0_4_ = (pQVar7->boundingRect).x1;
            uVar12._4_4_ = (pQVar7->boundingRect).y1;
            local_98 = (QPoint)((ulong)(uint)-(undefined4)uVar12 - (uVar12 & 0xffffffff00000000));
            local_88._0_16_ = QRect::translated(&local_68,&local_98);
            QPixmap::scroll((int)&local_58,(int)dx,(QRect *)(ulong)(uint)(int)dy,
                            (QRegion *)&local_88);
            QPixmapCache::insert((QPixmap *)&local_88);
            pKVar2 = (pQVar7->key).d;
            (pQVar7->key).d = (KeyData *)local_88.xp;
            local_88.xp = (qreal)pKVar2;
            QPixmapCache::Key::~Key((Key *)&local_88);
            lVar11 = 0;
            for (uVar12 = 0; auVar5 = (undefined1  [16])local_88._0_16_,
                uVar12 < (ulong)(pQVar7->exposed).d.size; uVar12 = uVar12 + 1) {
              pQVar8 = QList<QRectF>::data(&pQVar7->exposed);
              pdVar10 = (double *)((long)&pQVar8->xp + lVar11);
              if ((((rect->w != 0.0) || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))) {
                cVar6 = QRectF::intersects((QRectF *)pdVar10);
                if (cVar6 != '\0') goto LAB_00578bdd;
              }
              else {
LAB_00578bdd:
                *pdVar10 = *pdVar10 + dx;
                pdVar10[1] = pdVar10[1] + dy;
              }
              lVar11 = lVar11 + 0x20;
            }
            uVar1 = (pQVar7->boundingRect).x1;
            uVar3 = (pQVar7->boundingRect).y1;
            local_88.xp._4_4_ = uVar3;
            local_88.xp._0_4_ = uVar1;
            local_88.yp = auVar5._8_8_;
            QRegion::translate(&local_90,(QPoint *)&local_88);
            r = (QRect *)QRegion::begin();
            pQVar9 = (QRect *)QRegion::end();
            for (; r != pQVar9; r = r + 1) {
              QRectF::QRectF(&local_88,r);
              QList<QRectF>::emplaceBack<QRectF>(&pQVar7->exposed,&local_88);
            }
            QGraphicsScenePrivate::markDirty
                      (*(QGraphicsScenePrivate **)&this_00->scene->field_0x8,this,rect,false,false,
                       false,false,false);
            QRegion::~QRegion(&local_90);
          }
        }
        QPixmap::~QPixmap((QPixmap *)&local_58);
        goto LAB_00578c8c;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      update(this,rect);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::scroll(qreal dx, qreal dy, const QRectF &rect)
{
    Q_D(QGraphicsItem);
    if (dx == 0.0 && dy == 0.0)
        return;
    if (!d->scene)
        return;

    // Accelerated scrolling means moving pixels from one location to another
    // and only redraw the newly exposed area. The following requirements must
    // be fulfilled in order to do that:
    //
    // 1) Item is opaque.
    // 2) Item is not overlapped by other items.
    //
    // There's (yet) no way to detect whether an item is opaque or not, which means
    // we cannot do accelerated scrolling unless the cache is enabled. In case of using
    // DeviceCoordinate cache we also have to take the device transform into account in
    // order to determine whether we can do accelerated scrolling or not. That's left out
    // for simplicity here, but it is definitely something we can consider in the future
    // as a performance improvement.
    if (d->cacheMode != QGraphicsItem::ItemCoordinateCache
        || !qFuzzyIsNull(dx - int(dx)) || !qFuzzyIsNull(dy - int(dy))) {
        update(rect);
        return;
    }

    QGraphicsItemCache *cache = d->extraItemCache();
    if (cache->allExposed || cache->fixedSize.isValid()) {
        // Cache is either invalidated or item is scaled (see QGraphicsItem::setCacheMode).
        update(rect);
        return;
    }

    // Find pixmap in cache.
    QPixmap cachedPixmap;
    if (!QPixmapCache::find(cache->key, &cachedPixmap)) {
        update(rect);
        return;
    }

    QRect scrollRect = (rect.isNull() ? boundingRect() : rect).toAlignedRect();
    if (!scrollRect.intersects(cache->boundingRect))
        return; // Nothing to scroll.

    // Remove from cache to avoid deep copy when modifying.
    QPixmapCache::remove(cache->key);

    QRegion exposed;
    cachedPixmap.scroll(dx, dy, scrollRect.translated(-cache->boundingRect.topLeft()), &exposed);

    // Reinsert into cache.
    cache->key = QPixmapCache::insert(cachedPixmap);

    // Translate the existing expose.
    for (int i = 0; i < cache->exposed.size(); ++i) {
        QRectF &e = cache->exposed[i];
        if (!rect.isNull() && !e.intersects(rect))
            continue;
        e.translate(dx, dy);
    }

    // Append newly exposed areas. Note that the exposed region is currently
    // in pixmap coordinates, so we have to translate it to item coordinates.
    exposed.translate(cache->boundingRect.topLeft());
    for (const QRect &exposedRect : exposed)
        cache->exposed += exposedRect;

    // Trigger update. This will redraw the newly exposed area and make sure
    // the pixmap is re-blitted in case there are overlapping items.
    d->scene->d_func()->markDirty(this, rect);
}